

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ImGuiTabItem *tab_00;
  undefined8 in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiTabItem *tab;
  int tab_n;
  ImDrawList *draw_list;
  bool open;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [256];
  float in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe64;
  char *local_198;
  uint in_stack_fffffffffffffe70;
  ImGuiID in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  uint uVar7;
  undefined2 in_stack_fffffffffffffe7c;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  char cVar8;
  undefined8 in_stack_fffffffffffffe80;
  ImGuiCol idx;
  uint local_15c;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImVec2 in_stack_fffffffffffffeb0;
  ImVec2 in_stack_fffffffffffffeb8;
  ImVec2 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffee8;
  ImU32 in_stack_fffffffffffffeec;
  ImVec2 *in_stack_fffffffffffffef0;
  ImVec2 *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  undefined1 auStack_18 [8];
  undefined8 local_10;
  ImGuiTabBar *local_8;
  
  idx = (ImGuiCol)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  pcVar6 = &stack0xfffffffffffffee8;
  iVar4 = in_RDI->PrevFrameVisible;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = GetFrameCount();
  bVar2 = iVar3 + -2 <= iVar4;
  pcVar5 = " *Inactive*";
  if (bVar2) {
    pcVar5 = "";
  }
  iVar4 = ImFormatString(pcVar6,(size_t)(auStack_18 + -(long)pcVar6),"%s 0x%08X (%d tabs)%s",
                         local_10,(ulong)local_8->ID,(ulong)(uint)(local_8->Tabs).Size,pcVar5);
  pcVar6 = pcVar6 + iVar4;
  if (!bVar2) {
    GetStyleColorVec4(1);
    PushStyleColor(idx,(ImVec4 *)
                       CONCAT17(in_stack_fffffffffffffe7f,
                                CONCAT16(in_stack_fffffffffffffe7e,
                                         CONCAT24(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78))));
  }
  bVar1 = TreeNode(local_8,"%s",&stack0xfffffffffffffee8);
  if (bVar2) {
    bVar2 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe60);
    if (bVar2) {
      GetForegroundDrawList();
      ImDrawList::AddRect(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                          in_stack_fffffffffffffee8,(ImDrawCornerFlags)((ulong)pcVar6 >> 0x20),
                          SUB84(pcVar6,0));
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec0,local_8->ScrollingRectMinX,
                     (local_8->BarRect).Min.y);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb8,local_8->ScrollingRectMinX,
                     (local_8->BarRect).Max.y);
      ImDrawList::AddLine((ImDrawList *)in_stack_fffffffffffffec0,
                          (ImVec2 *)in_stack_fffffffffffffeb8,(ImVec2 *)in_stack_fffffffffffffeb0,
                          (ImU32)in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb0,local_8->ScrollingRectMaxX,
                     (local_8->BarRect).Min.y);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea8,local_8->ScrollingRectMaxX,
                     (local_8->BarRect).Max.y);
      ImDrawList::AddLine((ImDrawList *)in_stack_fffffffffffffec0,
                          (ImVec2 *)in_stack_fffffffffffffeb8,(ImVec2 *)in_stack_fffffffffffffeb0,
                          (ImU32)in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
    }
  }
  else {
    PopStyleColor((int)in_stack_fffffffffffffe64);
  }
  if (bVar1) {
    for (local_15c = 0; (int)local_15c < (local_8->Tabs).Size; local_15c = local_15c + 1) {
      tab_00 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_15c);
      PushID((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if (bVar2) {
        TabBarQueueReorder(local_8,tab_00,-1);
      }
      SameLine(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if (bVar2) {
        TabBarQueueReorder(local_8,tab_00,1);
      }
      SameLine(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      cVar8 = '*';
      if (tab_00->ID != local_8->SelectedTabId) {
        cVar8 = ' ';
      }
      in_stack_fffffffffffffe70 = (uint)cVar8;
      in_stack_fffffffffffffe74 = tab_00->ID;
      uVar7 = local_15c;
      if (tab_00->NameOffset == -1) {
        local_198 = "";
      }
      else {
        local_198 = ImGuiTabBar::GetTabName(local_8,tab_00);
      }
      Text((char *)(double)tab_00->Offset,(double)tab_00->Width,(double)tab_00->ContentWidth,
           "%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",(ulong)uVar7,
           (ulong)in_stack_fffffffffffffe70,(ulong)in_stack_fffffffffffffe74,local_198);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(tab_bar, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}